

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_extension.cpp
# Opt level: O2

unique_ptr<duckdb::TableFunctionData,_std::default_delete<duckdb::TableFunctionData>,_true>
__thiscall
duckdb::ParquetMultiFileInfo::InitializeBindData
          (ParquetMultiFileInfo *this,MultiFileBindData *multi_file_data,
          unique_ptr<duckdb::BaseFileReaderOptions,_std::default_delete<duckdb::BaseFileReaderOptions>,_true>
          *options_p)

{
  idx_t iVar1;
  ulong uVar2;
  int iVar3;
  pointer pBVar4;
  pointer pPVar5;
  MultiFileList *pMVar6;
  undefined4 extraout_var;
  _Head_base<0UL,_duckdb::ParquetReadBindData_*,_false> local_20;
  
  make_uniq<duckdb::ParquetReadBindData>();
  pBVar4 = unique_ptr<duckdb::BaseFileReaderOptions,_std::default_delete<duckdb::BaseFileReaderOptions>,_true>
           ::operator->(options_p);
  pPVar5 = unique_ptr<duckdb::ParquetReadBindData,_std::default_delete<duckdb::ParquetReadBindData>,_true>
           ::operator->((unique_ptr<duckdb::ParquetReadBindData,_std::default_delete<duckdb::ParquetReadBindData>,_true>
                         *)&local_20);
  ParquetOptions::operator=(&pPVar5->parquet_options,(ParquetOptions *)(pBVar4 + 1));
  pPVar5 = unique_ptr<duckdb::ParquetReadBindData,_std::default_delete<duckdb::ParquetReadBindData>,_true>
           ::operator->((unique_ptr<duckdb::ParquetReadBindData,_std::default_delete<duckdb::ParquetReadBindData>,_true>
                         *)&local_20);
  if ((pPVar5->parquet_options).explicit_cardinality != 0) {
    pMVar6 = shared_ptr<duckdb::MultiFileList,_true>::operator->(&multi_file_data->file_list);
    iVar3 = (*pMVar6->_vptr_MultiFileList[6])(pMVar6);
    pPVar5 = unique_ptr<duckdb::ParquetReadBindData,_std::default_delete<duckdb::ParquetReadBindData>,_true>
             ::operator->((unique_ptr<duckdb::ParquetReadBindData,_std::default_delete<duckdb::ParquetReadBindData>,_true>
                           *)&local_20);
    iVar1 = (pPVar5->parquet_options).explicit_cardinality;
    pPVar5 = unique_ptr<duckdb::ParquetReadBindData,_std::default_delete<duckdb::ParquetReadBindData>,_true>
             ::operator->((unique_ptr<duckdb::ParquetReadBindData,_std::default_delete<duckdb::ParquetReadBindData>,_true>
                           *)&local_20);
    pPVar5->explicit_cardinality = iVar1;
    pPVar5 = unique_ptr<duckdb::ParquetReadBindData,_std::default_delete<duckdb::ParquetReadBindData>,_true>
             ::operator->((unique_ptr<duckdb::ParquetReadBindData,_std::default_delete<duckdb::ParquetReadBindData>,_true>
                           *)&local_20);
    uVar2 = pPVar5->explicit_cardinality;
    pPVar5 = unique_ptr<duckdb::ParquetReadBindData,_std::default_delete<duckdb::ParquetReadBindData>,_true>
             ::operator->((unique_ptr<duckdb::ParquetReadBindData,_std::default_delete<duckdb::ParquetReadBindData>,_true>
                           *)&local_20);
    pPVar5->initial_file_cardinality =
         uVar2 / (CONCAT44(extraout_var,iVar3) + (ulong)(CONCAT44(extraout_var,iVar3) == 0));
  }
  *(ParquetReadBindData **)this = local_20._M_head_impl;
  return (unique_ptr<duckdb::TableFunctionData,_std::default_delete<duckdb::TableFunctionData>_>)
         (unique_ptr<duckdb::TableFunctionData,_std::default_delete<duckdb::TableFunctionData>_>)
         this;
}

Assistant:

unique_ptr<TableFunctionData> ParquetMultiFileInfo::InitializeBindData(MultiFileBindData &multi_file_data,
                                                                       unique_ptr<BaseFileReaderOptions> options_p) {
	auto result = make_uniq<ParquetReadBindData>();
	// Set the explicit cardinality if requested
	auto &options = options_p->Cast<ParquetFileReaderOptions>();
	result->parquet_options = std::move(options.options);
	if (result->parquet_options.explicit_cardinality) {
		auto file_count = multi_file_data.file_list->GetTotalFileCount();
		result->explicit_cardinality = result->parquet_options.explicit_cardinality;
		result->initial_file_cardinality = result->explicit_cardinality / (file_count ? file_count : 1);
	}
	return std::move(result);
}